

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O0

void Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
               (uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,
               uint64_t *b,uint64_t *res)

{
  long lVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t i_34;
  uint64_t *puVar7;
  ulong uVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  uint64_t uStack_790;
  uint64_t uStack_788;
  uint64_t *local_780;
  uint64_t *local_778;
  uint64_t *local_770;
  uint64_t *local_768;
  uint64_t *local_760;
  uint64_t *local_758;
  uint64_t *local_750;
  uint64_t *local_748;
  uint64_t *local_740;
  uint64_t *local_738;
  uint64_t *ctx_n_9;
  uint64_t x_29;
  uint64_t *os_29;
  uint64_t *puStack_718;
  uint32_t i_33;
  uint64_t *res_j_29;
  uint64_t c_29;
  uint64_t x_28;
  uint64_t *os_28;
  uint64_t *puStack_6f0;
  uint32_t i_32;
  uint64_t *res_j_28;
  uint64_t c_28;
  uint64_t x_27;
  uint64_t *os_27;
  uint64_t *puStack_6c8;
  uint32_t i_31;
  uint64_t *res_j_27;
  uint64_t c_27;
  uint64_t x_26;
  uint64_t *os_26;
  uint64_t *puStack_6a0;
  uint32_t i_30;
  uint64_t *res_j_26;
  uint64_t c_26;
  uint64_t x_25;
  uint64_t *os_25;
  uint64_t *puStack_678;
  uint32_t i_29;
  uint64_t *res_j_25;
  uint64_t c_25;
  uint64_t x_24;
  uint64_t *os_24;
  uint64_t *puStack_650;
  uint32_t i_28;
  uint64_t *res_j_24;
  uint64_t c_24;
  uint64_t x_23;
  uint64_t *os_23;
  uint64_t *puStack_628;
  uint32_t i_27;
  uint64_t *res_j_23;
  uint64_t c_23;
  uint64_t x_22;
  uint64_t *os_22;
  uint64_t *puStack_600;
  uint32_t i_26;
  uint64_t *res_j_22;
  uint64_t c_22;
  uint64_t x_21;
  uint64_t *os_21;
  uint64_t *puStack_5d8;
  uint32_t i_25;
  uint64_t *res_j_21;
  uint64_t c_21;
  uint64_t x_20;
  uint64_t *os_20;
  uint64_t *puStack_5b0;
  uint32_t i_24;
  uint64_t *res_j_20;
  uint64_t c_20;
  uint64_t x_19;
  uint64_t *os_19;
  uint64_t *puStack_588;
  uint32_t i_23;
  uint64_t *res_j_19;
  uint64_t c_19;
  uint64_t x_18;
  uint64_t *os_18;
  uint64_t *puStack_560;
  uint32_t i_22;
  uint64_t *res_j_18;
  uint64_t c_18;
  uint64_t x_17;
  uint64_t *os_17;
  uint64_t *puStack_538;
  uint32_t i_21;
  uint64_t *res_j_17;
  uint64_t c_17;
  uint64_t x_16;
  uint64_t *os_16;
  uint64_t *puStack_510;
  uint32_t i_20;
  uint64_t *res_j_16;
  uint64_t c_16;
  uint64_t x_15;
  uint64_t *os_15;
  uint64_t *puStack_4e8;
  uint32_t i_19;
  uint64_t *res_j_15;
  uint64_t c_15;
  uint64_t uStack_4d0;
  uint32_t i1_2;
  uint64_t bits_l;
  uint64_t *puStack_4c0;
  uint32_t k;
  uint64_t *ctx_n_13;
  uint64_t *ctx_n_12;
  uint64_t *ctx_n_11;
  uint64_t *ctx_n_10;
  uint32_t i_18;
  uint32_t i0_2;
  unsigned_long __vla_expr8;
  uint64_t *ctx_r2_1;
  uint64_t *ctx_n_8;
  uint64_t x_14;
  uint64_t *os_14;
  uint64_t *puStack_468;
  uint32_t i_17;
  uint64_t *res_j_14;
  uint64_t c_14;
  uint64_t x_13;
  uint64_t *os_13;
  uint64_t *puStack_440;
  uint32_t i_16;
  uint64_t *res_j_13;
  uint64_t c_13;
  uint64_t x_12;
  uint64_t *os_12;
  uint64_t *puStack_418;
  uint32_t i_15;
  uint64_t *res_j_12;
  uint64_t c_12;
  uint64_t x_11;
  uint64_t *os_11;
  uint64_t *puStack_3f0;
  uint32_t i_14;
  uint64_t *res_j_11;
  uint64_t c_11;
  uint64_t x_10;
  uint64_t *os_10;
  uint64_t *puStack_3c8;
  uint32_t i_13;
  uint64_t *res_j_10;
  uint64_t c_10;
  uint64_t x_9;
  uint64_t *os_9;
  uint64_t *puStack_3a0;
  uint32_t i_12;
  uint64_t *res_j_9;
  uint64_t c_9;
  uint64_t x_8;
  uint64_t *os_8;
  uint64_t *puStack_378;
  uint32_t i_11;
  uint64_t *res_j_8;
  uint64_t c_8;
  uint64_t x_7;
  uint64_t *os_7;
  uint64_t *puStack_350;
  uint32_t i_10;
  uint64_t *res_j_7;
  uint64_t c_7;
  uint64_t x_6;
  uint64_t *os_6;
  uint64_t *puStack_328;
  uint32_t i_9;
  uint64_t *res_j_6;
  uint64_t c_6;
  uint64_t x_5;
  uint64_t *os_5;
  uint64_t *puStack_300;
  uint32_t i_8;
  uint64_t *res_j_5;
  uint64_t c_5;
  uint64_t x_4;
  uint64_t *os_4;
  uint64_t *puStack_2d8;
  uint32_t i_7;
  uint64_t *res_j_4;
  uint64_t c_4;
  uint64_t x_3;
  uint64_t *os_3;
  uint64_t *puStack_2b0;
  uint32_t i_6;
  uint64_t *res_j_3;
  uint64_t c_3;
  uint64_t x_2;
  uint64_t *os_2;
  uint64_t *puStack_288;
  uint32_t i_5;
  uint64_t *res_j_2;
  uint64_t c_2;
  uint64_t x_1;
  uint64_t *os_1;
  uint64_t *puStack_260;
  uint32_t i_4;
  uint64_t *res_j_1;
  uint64_t c_1;
  uint64_t x;
  uint64_t *os;
  uint64_t *puStack_238;
  uint32_t i_3;
  uint64_t *res_j;
  uint64_t c;
  uint64_t uStack_220;
  uint32_t i1_1;
  uint64_t bits_c;
  uint64_t *puStack_210;
  uint32_t i0_1;
  uint64_t *ctx_n_7;
  uint64_t *t2_6;
  uint64_t *ctx_n1_7;
  uint64_t *t11_6;
  uint64_t *ctx_n_6;
  uint64_t *t2_5;
  uint64_t *ctx_n1_6;
  uint64_t *t11_5;
  uint64_t *ctx_n_5;
  uint64_t *t2_4;
  uint64_t *ctx_n1_5;
  uint64_t *t11_4;
  uint64_t *ctx_n_4;
  uint64_t *t2_3;
  uint64_t *ctx_n1_4;
  uint64_t *t11_3;
  uint64_t *ctx_n_3;
  uint64_t *t2_2;
  uint64_t *ctx_n1_3;
  uint64_t *t11_2;
  uint64_t *ctx_n_2;
  uint64_t *t2_1;
  uint64_t *ctx_n1_2;
  uint64_t *t11_1;
  uint64_t *ctx_n_1;
  uint64_t *t2;
  uint64_t *ctx_n1_1;
  uint64_t *t11;
  uint64_t *puStack_128;
  uint32_t i_2;
  uint64_t *ctx_r20;
  uint64_t *ctx_n0;
  uint64_t *t1;
  uint64_t *t0;
  unsigned_long __vla_expr7;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  ulong uStack_e8;
  uint32_t bLen;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  ulong local_d0;
  uint64_t dummy_1;
  uint64_t *puStack_c0;
  uint32_t i_1;
  uint64_t sw0;
  uint64_t *ctx_n1;
  uint64_t *ctx_n0_1;
  uint64_t dummy;
  ulong uStack_98;
  uint32_t i;
  uint64_t sw1;
  uint64_t bit;
  uint64_t tmp;
  uint local_78;
  uint32_t j;
  uint32_t i1;
  uint32_t i0;
  uint64_t *ctx_r2;
  uint64_t *ctx_n;
  uint64_t sw;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint32_t local_34;
  uint64_t *puStack_30;
  uint32_t bBits_local;
  uint64_t *a_local;
  uint64_t *r2_local;
  uint64_t mu_local;
  uint64_t *n_local;
  uint32_t len_local;
  
  __vla_expr0 = (unsigned_long)&uStack_788;
  __vla_expr3 = (unsigned_long)&uStack_788;
  local_34 = bBits;
  puStack_30 = a;
  a_local = r2;
  r2_local = (uint64_t *)mu;
  mu_local = (uint64_t)n;
  n_local._4_4_ = len;
  if (bBits < 200) {
    if (0x1fffffffffffffff < (ulong)len) {
      uStack_790 = 0x1e6af5;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x7d1);
      uStack_790 = 0x1e6aff;
      exit(0xfd);
    }
    __vla_expr1 = (unsigned_long)len;
    lVar1 = -(__vla_expr1 * 8 + 0xf & 0xfffffffffffffff0);
    puVar10 = (uint64_t *)((long)&uStack_788 + lVar1);
    local_740 = puVar10;
    *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6b3b;
    memset(puVar10,0,(ulong)len << 3);
    uVar5 = n_local._4_4_;
    uVar4 = mu_local;
    puVar7 = r2_local;
    puVar3 = a_local;
    puVar11 = puStack_30;
    puVar2 = local_740;
    *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6b5a;
    Hacl_Bignum_Montgomery_bn_to_mont_u64
              (uVar5,(uint64_t *)uVar4,(uint64_t)puVar7,puVar3,puVar11,puVar2);
    if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
      *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6b86;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x7d5);
      *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6b90;
      exit(0xfd);
    }
    __vla_expr2 = (unsigned_long)n_local._4_4_;
    puVar10 = (uint64_t *)((long)puVar10 - (__vla_expr2 * 8 + 0xf & 0xfffffffffffffff0));
    uVar8 = (ulong)n_local._4_4_;
    local_748 = puVar10;
    puVar10[-1] = 0x1e6bc7;
    memset(puVar10,0,uVar8 << 3);
    if (0x1fffffffffffffff < (ulong)(n_local._4_4_ * 2)) {
      puVar10[-1] = 0x1e6bf8;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x7d8);
      puVar10[-1] = 0x1e6c02;
      exit(0xfd);
    }
    sw = (uint64_t)(n_local._4_4_ * 2);
    puVar10 = puVar10 + -sw;
    uVar6 = n_local._4_4_ * 2;
    local_750 = puVar10;
    puVar10[-1] = 0x1e6c40;
    memset(puVar10,0,(ulong)uVar6 << 3);
    uVar4 = mu_local;
    puVar2 = local_750;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e6c59;
    memcpy(puVar2,(void *)uVar4,uVar8 << 3);
    puVar2 = a_local;
    puVar11 = local_750 + n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e6c7c;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar6 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_748;
    puVar2 = local_750;
    ctx_n = (uint64_t *)0x0;
    ctx_r2 = local_750;
    puVar7 = local_750 + n_local._4_4_;
    _i1 = puVar7;
    puVar10[-1] = 0x1e6cb8;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar6,puVar2,(uint64_t)puVar3,puVar7,puVar11);
    for (j = 0; uVar6 = n_local._4_4_, uVar4 = mu_local, puVar7 = r2_local, puVar3 = local_740,
        puVar11 = local_748, puVar2 = local_750, j < local_34; j = j + 1) {
      local_78 = (local_34 - j) - 1 >> 6;
      tmp._4_4_ = (local_34 - j) - 1 & 0x3f;
      bit = b[local_78];
      sw1 = bit >> (sbyte)tmp._4_4_ & 1;
      uStack_98 = sw1 ^ (ulong)ctx_n;
      for (dummy._4_4_ = 0; dummy._4_4_ < n_local._4_4_; dummy._4_4_ = dummy._4_4_ + 1) {
        ctx_n0_1 = (uint64_t *)(-uStack_98 & (local_748[dummy._4_4_] ^ local_740[dummy._4_4_]));
        local_748[dummy._4_4_] = local_748[dummy._4_4_] ^ (ulong)ctx_n0_1;
        local_740[dummy._4_4_] = local_740[dummy._4_4_] ^ (ulong)ctx_n0_1;
      }
      ctx_n1 = local_750;
      puVar10[-1] = 0x1e6de5;
      bn_almost_mont_mul_u64(uVar6,puVar2,(uint64_t)puVar7,puVar3,puVar11,puVar3);
      uVar5 = n_local._4_4_;
      puVar3 = r2_local;
      puVar11 = local_748;
      puVar2 = local_750;
      sw0 = (uint64_t)local_750;
      puVar10[-1] = 0x1e6e10;
      bn_almost_mont_sqr_u64(uVar5,puVar2,(uint64_t)puVar3,puVar11,puVar11);
      ctx_n = (uint64_t *)sw1;
    }
    puStack_c0 = ctx_n;
    for (dummy_1._4_4_ = 0; dummy_1._4_4_ < n_local._4_4_; dummy_1._4_4_ = dummy_1._4_4_ + 1) {
      local_d0 = -(long)ctx_n & (local_748[dummy_1._4_4_] ^ local_740[dummy_1._4_4_]);
      local_748[dummy_1._4_4_] = local_748[dummy_1._4_4_] ^ local_d0;
      local_740[dummy_1._4_4_] = local_740[dummy_1._4_4_] ^ local_d0;
    }
    puVar10[-1] = 0x1e6ee3;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar6,(uint64_t *)uVar4,(uint64_t)puVar7,puVar11,res);
  }
  else {
    if (0x1fffffffffffffff < (ulong)len) {
      uStack_790 = 0x1e6f1d;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x7fe);
      uStack_790 = 0x1e6f27;
      exit(0xfd);
    }
    __vla_expr4 = (unsigned_long)len;
    lVar1 = -(__vla_expr4 * 8 + 0xf & 0xfffffffffffffff0);
    puVar10 = (uint64_t *)((long)&uStack_788 + lVar1);
    local_758 = puVar10;
    *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6f69;
    memset(puVar10,0,(ulong)len << 3);
    uVar5 = n_local._4_4_;
    uVar4 = mu_local;
    puVar7 = r2_local;
    puVar3 = a_local;
    puVar11 = puStack_30;
    puVar2 = local_758;
    *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6f88;
    Hacl_Bignum_Montgomery_bn_to_mont_u64
              (uVar5,(uint64_t *)uVar4,(uint64_t)puVar7,puVar3,puVar11,puVar2);
    if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
      *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6fb4;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x802);
      *(undefined8 *)((long)&uStack_790 + lVar1) = 0x1e6fbe;
      exit(0xfd);
    }
    uStack_e8 = (ulong)n_local._4_4_;
    puVar10 = (uint64_t *)((long)puVar10 - (uStack_e8 * 8 + 0xf & 0xfffffffffffffff0));
    uVar8 = (ulong)n_local._4_4_;
    local_760 = puVar10;
    puVar10[-1] = 0x1e6ff8;
    memset(puVar10,0,uVar8 << 3);
    if (local_34 == 0) {
      __vla_expr5._4_4_ = 1;
    }
    else {
      __vla_expr5._4_4_ = (local_34 - 1 >> 6) + 1;
    }
    if (0x1fffffffffffffff < (ulong)(n_local._4_4_ * 2)) {
      puVar10[-1] = 0x1e704f;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x80e);
      puVar10[-1] = 0x1e7059;
      exit(0xfd);
    }
    __vla_expr6 = (unsigned_long)(n_local._4_4_ * 2);
    puVar10 = puVar10 + -__vla_expr6;
    uVar6 = n_local._4_4_ * 2;
    local_768 = puVar10;
    puVar10[-1] = 0x1e709a;
    memset(puVar10,0,(ulong)uVar6 << 3);
    uVar4 = mu_local;
    puVar2 = local_768;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e70b3;
    memcpy(puVar2,(void *)uVar4,uVar8 << 3);
    puVar2 = a_local;
    puVar11 = local_768 + n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e70d6;
    memcpy(puVar11,puVar2,uVar8 << 3);
    if (0x1fffffffffffffff < (ulong)(n_local._4_4_ << 4)) {
      puVar10[-1] = 0x1e7107;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x813);
      puVar10[-1] = 0x1e7111;
      exit(0xfd);
    }
    __vla_expr7 = (unsigned_long)(n_local._4_4_ << 4);
    puVar10 = puVar10 + -__vla_expr7;
    uVar6 = n_local._4_4_ << 4;
    local_770 = puVar10;
    puVar10[-1] = 0x1e714e;
    memset(puVar10,0,(ulong)uVar6 << 3);
    if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
      puVar10[-1] = 0x1e717a;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x816);
      puVar10[-1] = 0x1e7184;
      exit(0xfd);
    }
    t0 = (uint64_t *)(ulong)n_local._4_4_;
    puVar10 = (uint64_t *)((long)puVar10 - ((long)t0 * 8 + 0xfU & 0xfffffffffffffff0));
    uVar8 = (ulong)n_local._4_4_;
    local_778 = puVar10;
    puVar10[-1] = 0x1e71be;
    memset(puVar10,0,uVar8 << 3);
    uVar6 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_770;
    t1 = local_770;
    ctx_n0 = local_770 + n_local._4_4_;
    ctx_r20 = local_768;
    puVar7 = local_768 + n_local._4_4_;
    puStack_128 = puVar7;
    puVar10[-1] = 0x1e721d;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar6,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar11 = ctx_n0;
    puVar2 = local_758;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7239;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    t11._4_4_ = 0;
    puVar7 = local_770 + n_local._4_4_;
    t2 = local_768;
    ctx_n1_1 = puVar7;
    puVar10[-1] = 0x1e7296;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e72ca;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_1 = local_768;
    ctx_n_1 = puVar9;
    puVar10[-1] = 0x1e7326;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e735a;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_1 = local_768;
    ctx_n1_2 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e73bc;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e73f0;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_2 = local_768;
    ctx_n_2 = puVar9;
    puVar10[-1] = 0x1e744c;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7480;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_2 = local_768;
    ctx_n1_3 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e74e2;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7516;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_3 = local_768;
    ctx_n_3 = puVar9;
    puVar10[-1] = 0x1e7572;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e75a6;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_3 = local_768;
    ctx_n1_4 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e7608;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e763c;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_4 = local_768;
    ctx_n_4 = puVar9;
    puVar10[-1] = 0x1e7698;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e76cc;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_4 = local_768;
    ctx_n1_5 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e772e;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7762;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_5 = local_768;
    ctx_n_5 = puVar9;
    puVar10[-1] = 0x1e77be;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e77f2;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_5 = local_768;
    ctx_n1_6 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e7854;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7888;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    t11_6 = local_768;
    ctx_n_6 = puVar9;
    puVar10[-1] = 0x1e78e4;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7918;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar3 = r2_local;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar7 = local_770 + (t11._4_4_ + 2) * n_local._4_4_;
    t2_6 = local_768;
    ctx_n1_7 = puVar7;
    t11._4_4_ = t11._4_4_ + 1;
    puVar10[-1] = 0x1e797a;
    bn_almost_mont_sqr_u64(uVar5,puVar11,(uint64_t)puVar3,puVar7,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e79ae;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar5 = n_local._4_4_;
    puVar7 = r2_local;
    puVar3 = local_758;
    puVar11 = local_768;
    puVar2 = local_778;
    puVar9 = local_770 + (t11._4_4_ * 2 + 2) * n_local._4_4_;
    puStack_210 = local_768;
    ctx_n_7 = puVar9;
    puVar10[-1] = 0x1e7a0a;
    bn_almost_mont_mul_u64(uVar5,puVar11,(uint64_t)puVar7,puVar3,puVar9,puVar2);
    puVar2 = local_778;
    puVar11 = local_770 + (t11._4_4_ * 2 + 3) * n_local._4_4_;
    uVar8 = (ulong)n_local._4_4_;
    puVar10[-1] = 0x1e7a3e;
    memcpy(puVar11,puVar2,uVar8 << 3);
    uVar6 = n_local._4_4_;
    puVar3 = r2_local;
    uVar5 = __vla_expr5._4_4_;
    puVar11 = local_760;
    puVar2 = local_768;
    t11._4_4_ = t11._4_4_ + 1;
    if ((local_34 & 3) == 0) {
      ctx_r2_1 = local_768;
      puVar7 = local_768 + n_local._4_4_;
      __vla_expr8 = (unsigned_long)puVar7;
      puVar10[-1] = 0x1e87bc;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar6,puVar2,(uint64_t)puVar3,puVar7,puVar11);
    }
    else {
      uVar6 = local_34 & 0xfffffffc;
      bits_c._4_4_ = uVar6;
      puVar10[-1] = 0x1e7a87;
      uStack_220 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar5,b,uVar6,4);
      puVar11 = local_760;
      puVar2 = local_770;
      uVar8 = (ulong)n_local._4_4_;
      puVar10[-1] = 0x1e7ab7;
      memcpy(puVar11,puVar2,uVar8 << 3);
      uVar4 = uStack_220;
      c._4_4_ = 0;
      puVar10[-1] = 0x1e7ada;
      res_j = (uint64_t *)FStar_UInt64_eq_mask(uVar4,1);
      uVar4 = uStack_220;
      puStack_238 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os._4_4_ = 0; os._4_4_ < n_local._4_4_; os._4_4_ = os._4_4_ + 1) {
        x = (uint64_t)local_760;
        c_1 = (ulong)res_j & puStack_238[os._4_4_] |
              ((ulong)res_j ^ 0xffffffffffffffff) & local_760[os._4_4_];
        local_760[os._4_4_] = c_1;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7bb3;
      res_j_1 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_260 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_1._4_4_ = 0; os_1._4_4_ < n_local._4_4_; os_1._4_4_ = os_1._4_4_ + 1) {
        x_1 = (uint64_t)local_760;
        c_2 = (ulong)res_j_1 & puStack_260[os_1._4_4_] |
              ((ulong)res_j_1 ^ 0xffffffffffffffff) & local_760[os_1._4_4_];
        local_760[os_1._4_4_] = c_2;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7c8c;
      res_j_2 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_288 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_2._4_4_ = 0; os_2._4_4_ < n_local._4_4_; os_2._4_4_ = os_2._4_4_ + 1) {
        x_2 = (uint64_t)local_760;
        c_3 = (ulong)res_j_2 & puStack_288[os_2._4_4_] |
              ((ulong)res_j_2 ^ 0xffffffffffffffff) & local_760[os_2._4_4_];
        local_760[os_2._4_4_] = c_3;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7d65;
      res_j_3 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_2b0 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_3._4_4_ = 0; os_3._4_4_ < n_local._4_4_; os_3._4_4_ = os_3._4_4_ + 1) {
        x_3 = (uint64_t)local_760;
        c_4 = (ulong)res_j_3 & puStack_2b0[os_3._4_4_] |
              ((ulong)res_j_3 ^ 0xffffffffffffffff) & local_760[os_3._4_4_];
        local_760[os_3._4_4_] = c_4;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7e3e;
      res_j_4 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_2d8 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_4._4_4_ = 0; os_4._4_4_ < n_local._4_4_; os_4._4_4_ = os_4._4_4_ + 1) {
        x_4 = (uint64_t)local_760;
        c_5 = (ulong)res_j_4 & puStack_2d8[os_4._4_4_] |
              ((ulong)res_j_4 ^ 0xffffffffffffffff) & local_760[os_4._4_4_];
        local_760[os_4._4_4_] = c_5;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7f17;
      res_j_5 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_300 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_5._4_4_ = 0; os_5._4_4_ < n_local._4_4_; os_5._4_4_ = os_5._4_4_ + 1) {
        x_5 = (uint64_t)local_760;
        c_6 = (ulong)res_j_5 & puStack_300[os_5._4_4_] |
              ((ulong)res_j_5 ^ 0xffffffffffffffff) & local_760[os_5._4_4_];
        local_760[os_5._4_4_] = c_6;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e7ff0;
      res_j_6 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_328 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_6._4_4_ = 0; os_6._4_4_ < n_local._4_4_; os_6._4_4_ = os_6._4_4_ + 1) {
        x_6 = (uint64_t)local_760;
        c_7 = (ulong)res_j_6 & puStack_328[os_6._4_4_] |
              ((ulong)res_j_6 ^ 0xffffffffffffffff) & local_760[os_6._4_4_];
        local_760[os_6._4_4_] = c_7;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e80c9;
      res_j_7 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_350 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_7._4_4_ = 0; os_7._4_4_ < n_local._4_4_; os_7._4_4_ = os_7._4_4_ + 1) {
        x_7 = (uint64_t)local_760;
        c_8 = (ulong)res_j_7 & puStack_350[os_7._4_4_] |
              ((ulong)res_j_7 ^ 0xffffffffffffffff) & local_760[os_7._4_4_];
        local_760[os_7._4_4_] = c_8;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e81a2;
      res_j_8 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_378 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_8._4_4_ = 0; os_8._4_4_ < n_local._4_4_; os_8._4_4_ = os_8._4_4_ + 1) {
        x_8 = (uint64_t)local_760;
        c_9 = (ulong)res_j_8 & puStack_378[os_8._4_4_] |
              ((ulong)res_j_8 ^ 0xffffffffffffffff) & local_760[os_8._4_4_];
        local_760[os_8._4_4_] = c_9;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e827b;
      res_j_9 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_3a0 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_9._4_4_ = 0; os_9._4_4_ < n_local._4_4_; os_9._4_4_ = os_9._4_4_ + 1) {
        x_9 = (uint64_t)local_760;
        c_10 = (ulong)res_j_9 & puStack_3a0[os_9._4_4_] |
               ((ulong)res_j_9 ^ 0xffffffffffffffff) & local_760[os_9._4_4_];
        local_760[os_9._4_4_] = c_10;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e8354;
      res_j_10 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_3c8 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_10._4_4_ = 0; os_10._4_4_ < n_local._4_4_; os_10._4_4_ = os_10._4_4_ + 1) {
        x_10 = (uint64_t)local_760;
        c_11 = (ulong)res_j_10 & puStack_3c8[os_10._4_4_] |
               ((ulong)res_j_10 ^ 0xffffffffffffffff) & local_760[os_10._4_4_];
        local_760[os_10._4_4_] = c_11;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e842d;
      res_j_11 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_3f0 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_11._4_4_ = 0; os_11._4_4_ < n_local._4_4_; os_11._4_4_ = os_11._4_4_ + 1) {
        x_11 = (uint64_t)local_760;
        c_12 = (ulong)res_j_11 & puStack_3f0[os_11._4_4_] |
               ((ulong)res_j_11 ^ 0xffffffffffffffff) & local_760[os_11._4_4_];
        local_760[os_11._4_4_] = c_12;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e8506;
      res_j_12 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_418 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_12._4_4_ = 0; os_12._4_4_ < n_local._4_4_; os_12._4_4_ = os_12._4_4_ + 1) {
        x_12 = (uint64_t)local_760;
        c_13 = (ulong)res_j_12 & puStack_418[os_12._4_4_] |
               ((ulong)res_j_12 ^ 0xffffffffffffffff) & local_760[os_12._4_4_];
        local_760[os_12._4_4_] = c_13;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e85df;
      res_j_13 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_220;
      puStack_440 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_13._4_4_ = 0; os_13._4_4_ < n_local._4_4_; os_13._4_4_ = os_13._4_4_ + 1) {
        x_13 = (uint64_t)local_760;
        c_14 = (ulong)res_j_13 & puStack_440[os_13._4_4_] |
               ((ulong)res_j_13 ^ 0xffffffffffffffff) & local_760[os_13._4_4_];
        local_760[os_13._4_4_] = c_14;
      }
      uVar6 = c._4_4_ + 2;
      c._4_4_ = c._4_4_ + 1;
      puVar10[-1] = 0x1e86b8;
      res_j_14 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      puStack_468 = local_770 + (c._4_4_ + 1) * n_local._4_4_;
      for (os_14._4_4_ = 0; os_14._4_4_ < n_local._4_4_; os_14._4_4_ = os_14._4_4_ + 1) {
        x_14 = (uint64_t)local_760;
        ctx_n_8 = (uint64_t *)
                  ((ulong)res_j_14 & puStack_468[os_14._4_4_] |
                  ((ulong)res_j_14 ^ 0xffffffffffffffff) & local_760[os_14._4_4_]);
        local_760[os_14._4_4_] = (uint64_t)ctx_n_8;
      }
      c._4_4_ = c._4_4_ + 1;
    }
    if (0x1fffffffffffffff < (ulong)n_local._4_4_) {
      puVar10[-1] = 0x1e87ea;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
             ,0x843);
      puVar10[-1] = 0x1e87f4;
      exit(0xfd);
    }
    _i_18 = (ulong)n_local._4_4_;
    puVar10 = (uint64_t *)((long)puVar10 - (_i_18 * 8 + 0xf & 0xfffffffffffffff0));
    uVar8 = (ulong)n_local._4_4_;
    local_780 = puVar10;
    puVar10[-1] = 0x1e882e;
    memset(puVar10,0,uVar8 << 3);
    for (ctx_n_10._4_4_ = 0; uVar5 = n_local._4_4_, uVar4 = mu_local, puVar3 = r2_local,
        puVar11 = local_760, puVar2 = local_768, ctx_n_10._4_4_ < local_34 >> 2;
        ctx_n_10._4_4_ = ctx_n_10._4_4_ + 1) {
      ctx_n_10._0_4_ = 0;
      ctx_n_11 = local_768;
      puVar10[-1] = 0x1e8883;
      bn_almost_mont_sqr_u64(uVar5,puVar2,(uint64_t)puVar3,puVar11,puVar11);
      uVar5 = n_local._4_4_;
      puVar3 = r2_local;
      puVar11 = local_760;
      puVar2 = local_768;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_12 = local_768;
      puVar10[-1] = 0x1e88bd;
      bn_almost_mont_sqr_u64(uVar5,puVar2,(uint64_t)puVar3,puVar11,puVar11);
      uVar5 = n_local._4_4_;
      puVar3 = r2_local;
      puVar11 = local_760;
      puVar2 = local_768;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      ctx_n_13 = local_768;
      puVar10[-1] = 0x1e88f7;
      bn_almost_mont_sqr_u64(uVar5,puVar2,(uint64_t)puVar3,puVar11,puVar11);
      uVar5 = n_local._4_4_;
      puVar3 = r2_local;
      puVar11 = local_760;
      puVar2 = local_768;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      puStack_4c0 = local_768;
      puVar10[-1] = 0x1e8931;
      bn_almost_mont_sqr_u64(uVar5,puVar2,(uint64_t)puVar3,puVar11,puVar11);
      uVar5 = __vla_expr5._4_4_;
      ctx_n_10._0_4_ = (int)ctx_n_10 + 1;
      i_34 = ((local_34 - (local_34 & 3)) + ctx_n_10._4_4_ * -4) - 4;
      bits_l._4_4_ = i_34;
      puVar10[-1] = 0x1e897b;
      uStack_4d0 = Hacl_Bignum_Lib_bn_get_bits_u64(uVar5,b,i_34,4);
      puVar11 = local_770;
      puVar2 = local_780;
      uVar8 = (ulong)n_local._4_4_;
      puVar10[-1] = 0x1e89ab;
      memcpy(puVar2,puVar11,uVar8 << 3);
      uVar4 = uStack_4d0;
      c_15._4_4_ = 0;
      puVar10[-1] = 0x1e89ce;
      res_j_15 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,1);
      uVar4 = uStack_4d0;
      puStack_4e8 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_15._4_4_ = 0; os_15._4_4_ < n_local._4_4_; os_15._4_4_ = os_15._4_4_ + 1) {
        x_15 = (uint64_t)local_780;
        c_16 = (ulong)res_j_15 & puStack_4e8[os_15._4_4_] |
               ((ulong)res_j_15 ^ 0xffffffffffffffff) & local_780[os_15._4_4_];
        local_780[os_15._4_4_] = c_16;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8aa7;
      res_j_16 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_510 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_16._4_4_ = 0; os_16._4_4_ < n_local._4_4_; os_16._4_4_ = os_16._4_4_ + 1) {
        x_16 = (uint64_t)local_780;
        c_17 = (ulong)res_j_16 & puStack_510[os_16._4_4_] |
               ((ulong)res_j_16 ^ 0xffffffffffffffff) & local_780[os_16._4_4_];
        local_780[os_16._4_4_] = c_17;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8b80;
      res_j_17 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_538 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_17._4_4_ = 0; os_17._4_4_ < n_local._4_4_; os_17._4_4_ = os_17._4_4_ + 1) {
        x_17 = (uint64_t)local_780;
        c_18 = (ulong)res_j_17 & puStack_538[os_17._4_4_] |
               ((ulong)res_j_17 ^ 0xffffffffffffffff) & local_780[os_17._4_4_];
        local_780[os_17._4_4_] = c_18;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8c59;
      res_j_18 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_560 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_18._4_4_ = 0; os_18._4_4_ < n_local._4_4_; os_18._4_4_ = os_18._4_4_ + 1) {
        x_18 = (uint64_t)local_780;
        c_19 = (ulong)res_j_18 & puStack_560[os_18._4_4_] |
               ((ulong)res_j_18 ^ 0xffffffffffffffff) & local_780[os_18._4_4_];
        local_780[os_18._4_4_] = c_19;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8d32;
      res_j_19 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_588 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_19._4_4_ = 0; os_19._4_4_ < n_local._4_4_; os_19._4_4_ = os_19._4_4_ + 1) {
        x_19 = (uint64_t)local_780;
        c_20 = (ulong)res_j_19 & puStack_588[os_19._4_4_] |
               ((ulong)res_j_19 ^ 0xffffffffffffffff) & local_780[os_19._4_4_];
        local_780[os_19._4_4_] = c_20;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8e0b;
      res_j_20 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_5b0 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_20._4_4_ = 0; os_20._4_4_ < n_local._4_4_; os_20._4_4_ = os_20._4_4_ + 1) {
        x_20 = (uint64_t)local_780;
        c_21 = (ulong)res_j_20 & puStack_5b0[os_20._4_4_] |
               ((ulong)res_j_20 ^ 0xffffffffffffffff) & local_780[os_20._4_4_];
        local_780[os_20._4_4_] = c_21;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8ee4;
      res_j_21 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_5d8 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_21._4_4_ = 0; os_21._4_4_ < n_local._4_4_; os_21._4_4_ = os_21._4_4_ + 1) {
        x_21 = (uint64_t)local_780;
        c_22 = (ulong)res_j_21 & puStack_5d8[os_21._4_4_] |
               ((ulong)res_j_21 ^ 0xffffffffffffffff) & local_780[os_21._4_4_];
        local_780[os_21._4_4_] = c_22;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e8fbd;
      res_j_22 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_600 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_22._4_4_ = 0; os_22._4_4_ < n_local._4_4_; os_22._4_4_ = os_22._4_4_ + 1) {
        x_22 = (uint64_t)local_780;
        c_23 = (ulong)res_j_22 & puStack_600[os_22._4_4_] |
               ((ulong)res_j_22 ^ 0xffffffffffffffff) & local_780[os_22._4_4_];
        local_780[os_22._4_4_] = c_23;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e9096;
      res_j_23 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_628 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_23._4_4_ = 0; os_23._4_4_ < n_local._4_4_; os_23._4_4_ = os_23._4_4_ + 1) {
        x_23 = (uint64_t)local_780;
        c_24 = (ulong)res_j_23 & puStack_628[os_23._4_4_] |
               ((ulong)res_j_23 ^ 0xffffffffffffffff) & local_780[os_23._4_4_];
        local_780[os_23._4_4_] = c_24;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e916f;
      res_j_24 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_650 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_24._4_4_ = 0; os_24._4_4_ < n_local._4_4_; os_24._4_4_ = os_24._4_4_ + 1) {
        x_24 = (uint64_t)local_780;
        c_25 = (ulong)res_j_24 & puStack_650[os_24._4_4_] |
               ((ulong)res_j_24 ^ 0xffffffffffffffff) & local_780[os_24._4_4_];
        local_780[os_24._4_4_] = c_25;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e9248;
      res_j_25 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_678 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_25._4_4_ = 0; os_25._4_4_ < n_local._4_4_; os_25._4_4_ = os_25._4_4_ + 1) {
        x_25 = (uint64_t)local_780;
        c_26 = (ulong)res_j_25 & puStack_678[os_25._4_4_] |
               ((ulong)res_j_25 ^ 0xffffffffffffffff) & local_780[os_25._4_4_];
        local_780[os_25._4_4_] = c_26;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e9321;
      res_j_26 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_6a0 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_26._4_4_ = 0; os_26._4_4_ < n_local._4_4_; os_26._4_4_ = os_26._4_4_ + 1) {
        x_26 = (uint64_t)local_780;
        c_27 = (ulong)res_j_26 & puStack_6a0[os_26._4_4_] |
               ((ulong)res_j_26 ^ 0xffffffffffffffff) & local_780[os_26._4_4_];
        local_780[os_26._4_4_] = c_27;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e93fa;
      res_j_27 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_6c8 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_27._4_4_ = 0; os_27._4_4_ < n_local._4_4_; os_27._4_4_ = os_27._4_4_ + 1) {
        x_27 = (uint64_t)local_780;
        c_28 = (ulong)res_j_27 & puStack_6c8[os_27._4_4_] |
               ((ulong)res_j_27 ^ 0xffffffffffffffff) & local_780[os_27._4_4_];
        local_780[os_27._4_4_] = c_28;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e94d3;
      res_j_28 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar4 = uStack_4d0;
      puStack_6f0 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_28._4_4_ = 0; os_28._4_4_ < n_local._4_4_; os_28._4_4_ = os_28._4_4_ + 1) {
        x_28 = (uint64_t)local_780;
        c_29 = (ulong)res_j_28 & puStack_6f0[os_28._4_4_] |
               ((ulong)res_j_28 ^ 0xffffffffffffffff) & local_780[os_28._4_4_];
        local_780[os_28._4_4_] = c_29;
      }
      uVar6 = c_15._4_4_ + 2;
      c_15._4_4_ = c_15._4_4_ + 1;
      puVar10[-1] = 0x1e95ac;
      res_j_29 = (uint64_t *)FStar_UInt64_eq_mask(uVar4,(ulong)uVar6);
      uVar6 = n_local._4_4_;
      puVar7 = r2_local;
      puVar3 = local_760;
      puVar11 = local_768;
      puVar2 = local_780;
      puStack_718 = local_770 + (c_15._4_4_ + 1) * n_local._4_4_;
      for (os_29._4_4_ = 0; os_29._4_4_ < n_local._4_4_; os_29._4_4_ = os_29._4_4_ + 1) {
        x_29 = (uint64_t)local_780;
        ctx_n_9 = (uint64_t *)
                  ((ulong)res_j_29 & puStack_718[os_29._4_4_] |
                  ((ulong)res_j_29 ^ 0xffffffffffffffff) & local_780[os_29._4_4_]);
        local_780[os_29._4_4_] = (uint64_t)ctx_n_9;
      }
      c_15._4_4_ = c_15._4_4_ + 1;
      local_738 = local_768;
      puVar10[-1] = 0x1e96a0;
      bn_almost_mont_mul_u64(uVar6,puVar11,(uint64_t)puVar7,puVar3,puVar2,puVar3);
    }
    puVar10[-1] = 0x1e96cf;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar5,(uint64_t *)uVar4,(uint64_t)puVar3,puVar11,res);
  }
  return;
}

Assistant:

void
Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64(
  uint32_t len,
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t aM[len];
    memset(aM, 0U, len * sizeof (uint64_t));
    Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
    KRML_CHECK_SIZE(sizeof (uint64_t), len);
    uint64_t resM[len];
    memset(resM, 0U, len * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
    uint64_t ctx[len + len];
    memset(ctx, 0U, (len + len) * sizeof (uint64_t));
    memcpy(ctx, n, len * sizeof (uint64_t));
    memcpy(ctx + len, r2, len * sizeof (uint64_t));
    uint64_t sw = 0ULL;
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 64U;
      uint32_t j = (bBits - i0 - 1U) % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      uint64_t sw1 = bit ^ sw;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t dummy = (0ULL - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;
      }
      uint64_t *ctx_n0 = ctx;
      bn_almost_mont_mul_u64(len, ctx_n0, mu, aM, resM, aM);
      uint64_t *ctx_n1 = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint64_t sw0 = sw;
    for (uint32_t i = 0U; i < len; i++)
    {
      uint64_t dummy = (0ULL - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;
    }
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
    return;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t aM[len];
  memset(aM, 0U, len * sizeof (uint64_t));
  Hacl_Bignum_Montgomery_bn_to_mont_u64(len, n, mu, r2, a, aM);
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t resM[len];
  memset(resM, 0U, len * sizeof (uint64_t));
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len + len);
  uint64_t ctx[len + len];
  memset(ctx, 0U, (len + len) * sizeof (uint64_t));
  memcpy(ctx, n, len * sizeof (uint64_t));
  memcpy(ctx + len, r2, len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len);
  uint64_t table[16U * len];
  memset(table, 0U, 16U * len * sizeof (uint64_t));
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint64_t));
  uint64_t *t0 = table;
  uint64_t *t1 = table + len;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + len;
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, len * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * len;
    uint64_t *ctx_n1 = ctx;
    bn_almost_mont_sqr_u64(len, ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * len, tmp, len * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * len;
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * len, tmp, len * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i0, 4U);
    memcpy(resM, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_c, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = resM;
        uint64_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;
      });
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len, ctx_n, mu, ctx_r2, resM);
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), len);
  uint64_t tmp0[len];
  memset(tmp0, 0U, len * sizeof (uint64_t));
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      bn_almost_mont_sqr_u64(len, ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    memcpy(tmp0, (uint64_t *)(table + 0U * len), len * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * len;
      for (uint32_t i = 0U; i < len; i++)
      {
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;
      });
    uint64_t *ctx_n = ctx;
    bn_almost_mont_mul_u64(len, ctx_n, mu, resM, tmp0, resM);
  }
  Hacl_Bignum_Montgomery_bn_from_mont_u64(len, n, mu, resM, res);
}